

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
          (RepeatedPtrFieldBase *this,
          Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_>
          *value)

{
  int iVar1;
  Arena *my_arena;
  void *pvVar2;
  bool bVar3;
  int __old_val;
  uint uVar4;
  Rep *pRVar5;
  Nonnull<const_char_*> pcVar6;
  Arena *value_arena;
  RepeatedPtrFieldBase *pRVar7;
  
  if (value == (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_>
                *)0x0) {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       ((void *)0x0,(void *)0x0,"value != nullptr");
  }
  else {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar6 == (Nonnull<const_char_*>)0x0) {
    value_arena = (Arena *)(value->_internal_metadata_).ptr_;
    if (((ulong)value_arena & 1) != 0) {
      value_arena = *(Arena **)((ulong)value_arena & 0xfffffffffffffffe);
    }
    my_arena = this->arena_;
    if (my_arena == value_arena) {
      bVar3 = AllocatedSizeAtCapacity(this);
      if (!bVar3) {
        pRVar7 = this;
        if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
          pRVar5 = rep(this);
          pRVar7 = (RepeatedPtrFieldBase *)pRVar5->elements;
        }
        iVar1 = this->current_size_;
        if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
          uVar4 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
        }
        else {
          pRVar5 = rep(this);
          uVar4 = pRVar5->allocated_size;
        }
        if (iVar1 < (int)uVar4) {
          pvVar2 = (&pRVar7->tagged_rep_or_elem_)[this->current_size_];
          if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
            uVar4 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
          }
          else {
            pRVar5 = rep(this);
            uVar4 = pRVar5->allocated_size;
          }
          (&pRVar7->tagged_rep_or_elem_)[(int)uVar4] = pvVar2;
        }
        iVar1 = this->current_size_;
        this->current_size_ = iVar1 + 1;
        (&pRVar7->tagged_rep_or_elem_)[iVar1] = value;
        if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
          pRVar5 = rep(this);
          pRVar5->allocated_size = pRVar5->allocated_size + 1;
        }
        return;
      }
    }
    AddAllocatedSlowWithCopy<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
              (this,value,value_arena,my_arena);
    return;
  }
  AddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>();
}

Assistant:

void AddAllocated(Value<TypeHandler>* value) {
    ABSL_DCHECK_NE(value, nullptr);
    Arena* element_arena = TypeHandler::GetArena(value);
    Arena* arena = GetArena();
    if (arena != element_arena || AllocatedSizeAtCapacity()) {
      AddAllocatedSlowWithCopy<TypeHandler>(value, element_arena, arena);
      return;
    }
    // Fast path: underlying arena representation (tagged pointer) is equal to
    // our arena pointer, and we can add to array without resizing it (at
    // least one slot that is not allocated).
    void** elems = elements();
    if (current_size_ < allocated_size()) {
      // Make space at [current] by moving first allocated element to end of
      // allocated list.
      elems[allocated_size()] = elems[current_size_];
    }
    elems[ExchangeCurrentSize(current_size_ + 1)] = value;
    if (!using_sso()) ++rep()->allocated_size;
  }